

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void indexed09_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  int16_t soffset;
  uint16_t offset;
  uint8_t post_byte;
  cs_m680x_op *op;
  cs_m680x *m680x;
  int16_t local_2e;
  uint16_t local_2c;
  byte local_29;
  cs_m680x_op *op_00;
  MCInst *MI_00;
  
  MI_00 = (MCInst *)&in_RSI->m680x;
  bVar1 = (in_RSI->m680x).op_count;
  (in_RSI->m680x).op_count = bVar1 + 1;
  op_00 = (in_RSI->m680x).operands + bVar1;
  local_29 = 0;
  local_2c = 0;
  local_2e = 0;
  uVar2 = *in_RDX;
  *in_RDX = uVar2 + 1;
  read_byte(in_RSI,&local_29,uVar2);
  op_00->type = M680X_OP_INDEXED;
  set_operand_size(in_RSI,op_00,'\x01');
  (op_00->field_1).imm = g_rr5_to_reg_ids[(int)((int)(uint)local_29 >> 5 & 3)];
  (op_00->field_1).idx.offset_reg = M680X_REG_INVALID;
  if ((local_29 & 0x80) == 0) {
    if ((local_29 & 0x10) == 0x10) {
      (op_00->field_1).idx.offset = local_29 | 0xfff0;
    }
    else {
      (op_00->field_1).idx.offset = local_29 & 0xf;
    }
    (op_00->field_1).idx.offset_addr = (op_00->field_1).idx.offset + *in_RDX;
    (op_00->field_1).idx.offset_bits = '\x05';
  }
  else {
    if ((local_29 & 0x10) == 0x10) {
      (op_00->field_1).idx.flags = (op_00->field_1).idx.flags | 1;
    }
    switch(local_29 & 0x1f) {
    case 0:
      (op_00->field_1).idx.inc_dec = '\x01';
      (op_00->field_1).idx.flags = (op_00->field_1).idx.flags | 4;
      break;
    case 1:
    case 0x11:
      (op_00->field_1).idx.inc_dec = '\x02';
      (op_00->field_1).idx.flags = (op_00->field_1).idx.flags | 4;
      break;
    case 2:
      (op_00->field_1).idx.inc_dec = -1;
      break;
    case 3:
    case 0x13:
      (op_00->field_1).idx.inc_dec = -2;
      break;
    case 4:
    case 0x14:
      break;
    case 5:
    case 0x15:
      (op_00->field_1).idx.offset_reg = M680X_REG_B;
      break;
    case 6:
    case 0x16:
      (op_00->field_1).idx.offset_reg = M680X_REG_A;
      break;
    default:
      (op_00->field_1).imm = 0;
      break;
    case 8:
    case 0x18:
      uVar2 = *in_RDX;
      *in_RDX = uVar2 + 1;
      read_byte_sign_extended(in_RSI,&local_2e,uVar2);
      (op_00->field_1).idx.offset = local_2e;
      (op_00->field_1).idx.offset_bits = '\b';
      break;
    case 9:
    case 0x19:
      read_word(in_RSI,&local_2c,*in_RDX);
      *in_RDX = *in_RDX + 2;
      (op_00->field_1).idx.offset = local_2c;
      (op_00->field_1).idx.offset_bits = '\x10';
      break;
    case 0xb:
    case 0x1b:
      (op_00->field_1).idx.offset_reg = M680X_REG_D;
      break;
    case 0xc:
    case 0x1c:
      (op_00->field_1).imm = 0x13;
      uVar2 = *in_RDX;
      *in_RDX = uVar2 + 1;
      read_byte_sign_extended(in_RSI,&local_2e,uVar2);
      (op_00->field_1).idx.offset_addr = local_2c + *in_RDX;
      (op_00->field_1).idx.offset = local_2e;
      (op_00->field_1).idx.offset_bits = '\b';
      break;
    case 0xd:
    case 0x1d:
      (op_00->field_1).imm = 0x13;
      read_word(in_RSI,&local_2c,*in_RDX);
      *in_RDX = *in_RDX + 2;
      (op_00->field_1).idx.offset_addr = local_2c + *in_RDX;
      (op_00->field_1).idx.offset = local_2c;
      (op_00->field_1).idx.offset_bits = '\x10';
      break;
    case 0x1f:
      op_00->type = M680X_OP_EXTENDED;
      *(byte *)((long)&(op_00->field_1).reg + 2) = 1;
      read_word(in_RSI,(uint16_t *)&(op_00->field_1).reg,*in_RDX);
      *in_RDX = *in_RDX + 2;
    }
  }
  if (((((in_RSI->insn == M680X_INS_LEAU) || (in_RSI->insn == M680X_INS_LEAS)) ||
       (in_RSI->insn == M680X_INS_LEAX)) || (in_RSI->insn == M680X_INS_LEAY)) &&
     ((MI_00->Opcode == 0xd || (MI_00->Opcode == 0xe)))) {
    add_reg_to_rw_list(MI_00,(m680x_reg)((ulong)op_00 >> 0x20),(e_access)op_00);
  }
  return;
}

Assistant:

static void indexed09_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];
	uint8_t post_byte = 0;
	uint16_t offset = 0;
	int16_t soffset = 0;

	read_byte(info, &post_byte, (*address)++);

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.base_reg = g_rr5_to_reg_ids[(post_byte >> 5) & 0x03];
	op->idx.offset_reg = M680X_REG_INVALID;

	if (!(post_byte & 0x80)) {
		// n5,R
		if ((post_byte & 0x10) == 0x10)
			op->idx.offset = post_byte | 0xfff0;
		else
			op->idx.offset = post_byte & 0x0f;

		op->idx.offset_addr = op->idx.offset + *address;
		op->idx.offset_bits = M680X_OFFSET_BITS_5;
	}
	else {
		if ((post_byte & 0x10) == 0x10)
			op->idx.flags |= M680X_IDX_INDIRECT;

		// indexed addressing
		switch (post_byte & 0x1f) {
		case 0x00: // ,R+
			op->idx.inc_dec = 1;
			op->idx.flags |= M680X_IDX_POST_INC_DEC;
			break;

		case 0x11: // [,R++]
		case 0x01: // ,R++
			op->idx.inc_dec = 2;
			op->idx.flags |= M680X_IDX_POST_INC_DEC;
			break;

		case 0x02: // ,-R
			op->idx.inc_dec = -1;
			break;

		case 0x13: // [,--R]
		case 0x03: // ,--R
			op->idx.inc_dec = -2;
			break;

		case 0x14: // [,R]
		case 0x04: // ,R
			break;

		case 0x15: // [B,R]
		case 0x05: // B,R
			op->idx.offset_reg = M680X_REG_B;
			break;

		case 0x16: // [A,R]
		case 0x06: // A,R
			op->idx.offset_reg = M680X_REG_A;
			break;

		case 0x1c: // [n8,PCR]
		case 0x0c: // n8,PCR
			op->idx.base_reg = M680X_REG_PC;
			read_byte_sign_extended(info, &soffset, (*address)++);
			op->idx.offset_addr = offset + *address;
			op->idx.offset = soffset;
			op->idx.offset_bits = M680X_OFFSET_BITS_8;
			break;

		case 0x18: // [n8,R]
		case 0x08: // n8,R
			read_byte_sign_extended(info, &soffset, (*address)++);
			op->idx.offset = soffset;
			op->idx.offset_bits = M680X_OFFSET_BITS_8;
			break;

		case 0x1d: // [n16,PCR]
		case 0x0d: // n16,PCR
			op->idx.base_reg = M680X_REG_PC;
			read_word(info, &offset, *address);
			*address += 2;
			op->idx.offset_addr = offset + *address;
			op->idx.offset = (int16_t)offset;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;
			break;

		case 0x19: // [n16,R]
		case 0x09: // n16,R
			read_word(info, &offset, *address);
			*address += 2;
			op->idx.offset = (int16_t)offset;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;
			break;

		case 0x1b: // [D,R]
		case 0x0b: // D,R
			op->idx.offset_reg = M680X_REG_D;
			break;

		case 0x1f: // [n16]
			op->type = M680X_OP_EXTENDED;
			op->ext.indirect = true;
			read_word(info, &op->ext.address, *address);
			*address += 2;
			break;

		default:
			op->idx.base_reg = M680X_REG_INVALID;
			break;
		}
	}

	if (((info->insn == M680X_INS_LEAU) ||
			(info->insn == M680X_INS_LEAS) ||
			(info->insn == M680X_INS_LEAX) ||
			(info->insn == M680X_INS_LEAY)) &&
		(m680x->operands[0].reg == M680X_REG_X ||
			(m680x->operands[0].reg == M680X_REG_Y)))
		// Only LEAX and LEAY modify CC register
		add_reg_to_rw_list(MI, M680X_REG_CC, MODIFY);
}